

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenReader.cpp
# Opt level: O0

int __thiscall ninx::parser::TokenReader::check_type(TokenReader *this,Type type)

{
  Type TVar1;
  Token *pTVar2;
  Token *token;
  Type type_local;
  TokenReader *this_local;
  
  pTVar2 = peek_token(this);
  if (pTVar2 == (Token *)0x0) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    TVar1 = (*pTVar2->_vptr_Token[2])();
    this_local._4_4_ = (uint)(TVar1 == type);
  }
  return this_local._4_4_;
}

Assistant:

int ninx::parser::TokenReader::check_type(Type type) {
    auto token = peek_token();
    if (!token) {
        return -1;
    }

    return token->get_type() == type;
}